

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O0

void chatra::emb::io::fileInputStream_close(Ct *ct)

{
  pointer pIVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  FileInputStreamData *self;
  Ct *ct_local;
  
  lock._M_device = (mutex_type *)derefSelfAsInput(ct);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&((FileInputStreamData *)lock._M_device)->mt);
  pIVar1 = std::unique_ptr<chatra::IFile,_std::default_delete<chatra::IFile>_>::operator->
                     ((unique_ptr<chatra::IFile,_std::default_delete<chatra::IFile>_> *)
                      ((long)&lock._M_device[1].super___mutex_base._M_mutex + 0x10));
  (*pIVar1->_vptr_IFile[2])();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

static void fileInputStream_close(Ct& ct) {
	auto* self = derefSelfAsInput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->close();
}